

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

void Curl_updateconninfo(connectdata *conn,curl_socket_t sockfd)

{
  uint err;
  Curl_easy *data;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _Bool _Var6;
  int iVar7;
  uint *puVar8;
  char *pcVar9;
  char *fmt;
  curl_socklen_t len;
  Curl_sockaddr_storage ssloc;
  Curl_sockaddr_storage ssrem;
  char buffer [128];
  socklen_t local_1ac;
  sockaddr local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  sockaddr local_128 [8];
  char local_a8 [136];
  
  if (conn->socktype == 2) {
    return;
  }
  if ((*(uint *)&(conn->bits).field_0x4 & 0x8000002) == 0) {
    data = conn->data;
    local_1ac = 0x80;
    iVar7 = getpeername(sockfd,local_128,&local_1ac);
    if (iVar7 == 0) {
      local_1ac = 0x80;
      local_1a8.sa_family = 0;
      local_1a8.sa_data[0] = '\0';
      local_1a8.sa_data[1] = '\0';
      local_1a8.sa_data[2] = '\0';
      local_1a8.sa_data[3] = '\0';
      local_1a8.sa_data[4] = '\0';
      local_1a8.sa_data[5] = '\0';
      local_1a8.sa_data[6] = '\0';
      local_1a8.sa_data[7] = '\0';
      local_1a8.sa_data[8] = '\0';
      local_1a8.sa_data[9] = '\0';
      local_1a8.sa_data[10] = '\0';
      local_1a8.sa_data[0xb] = '\0';
      local_1a8.sa_data[0xc] = '\0';
      local_1a8.sa_data[0xd] = '\0';
      local_198 = 0;
      uStack_190 = 0;
      local_188 = 0;
      uStack_180 = 0;
      local_178 = 0;
      uStack_170 = 0;
      local_168 = 0;
      uStack_160 = 0;
      local_158 = 0;
      uStack_150 = 0;
      local_148 = 0;
      uStack_140 = 0;
      local_138 = 0;
      uStack_130 = 0;
      iVar7 = getsockname(sockfd,&local_1a8,&local_1ac);
      if (iVar7 == 0) {
        _Var6 = getaddressinfo((sockaddr *)local_128,conn->primary_ip,&conn->primary_port);
        if (_Var6) {
          uVar1 = *(undefined8 *)conn->primary_ip;
          uVar2 = *(undefined8 *)(conn->primary_ip + 8);
          uVar3 = *(undefined8 *)(conn->primary_ip + 0x10);
          uVar4 = *(undefined8 *)(conn->primary_ip + 0x18);
          uVar5 = *(undefined8 *)(conn->primary_ip + 0x26);
          *(undefined8 *)(conn->ip_addr_str + 0x1e) = *(undefined8 *)(conn->primary_ip + 0x1e);
          *(undefined8 *)(conn->ip_addr_str + 0x26) = uVar5;
          *(undefined8 *)(conn->ip_addr_str + 0x10) = uVar3;
          *(undefined8 *)(conn->ip_addr_str + 0x18) = uVar4;
          *(undefined8 *)conn->ip_addr_str = uVar1;
          *(undefined8 *)(conn->ip_addr_str + 8) = uVar2;
          _Var6 = getaddressinfo((sockaddr *)&local_1a8,conn->local_ip,&conn->local_port);
          if (_Var6) goto LAB_00125d17;
          fmt = "ssloc inet_ntop() failed with errno %d: %s";
        }
        else {
          fmt = "ssrem inet_ntop() failed with errno %d: %s";
        }
      }
      else {
        fmt = "getsockname() failed with errno %d: %s";
      }
    }
    else {
      fmt = "getpeername() failed with errno %d: %s";
    }
    puVar8 = (uint *)__errno_location();
    err = *puVar8;
    pcVar9 = Curl_strerror(err,local_a8,0x80);
    Curl_failf(data,fmt,(ulong)err,pcVar9);
  }
  else {
LAB_00125d17:
    Curl_persistconninfo(conn);
  }
  return;
}

Assistant:

void Curl_updateconninfo(struct connectdata *conn, curl_socket_t sockfd)
{
  if(conn->socktype == SOCK_DGRAM)
    /* there's no connection! */
    return;

#if defined(HAVE_GETPEERNAME) || defined(HAVE_GETSOCKNAME)
  if(!conn->bits.reuse && !conn->bits.tcp_fastopen) {
    struct Curl_easy *data = conn->data;
    char buffer[STRERROR_LEN];
    struct Curl_sockaddr_storage ssrem;
    struct Curl_sockaddr_storage ssloc;
    curl_socklen_t len;
#ifdef HAVE_GETPEERNAME
    len = sizeof(struct Curl_sockaddr_storage);
    if(getpeername(sockfd, (struct sockaddr*) &ssrem, &len)) {
      int error = SOCKERRNO;
      failf(data, "getpeername() failed with errno %d: %s",
            error, Curl_strerror(error, buffer, sizeof(buffer)));
      return;
    }
#endif
#ifdef HAVE_GETSOCKNAME
    len = sizeof(struct Curl_sockaddr_storage);
    memset(&ssloc, 0, sizeof(ssloc));
    if(getsockname(sockfd, (struct sockaddr*) &ssloc, &len)) {
      int error = SOCKERRNO;
      failf(data, "getsockname() failed with errno %d: %s",
            error, Curl_strerror(error, buffer, sizeof(buffer)));
      return;
    }
#endif
#ifdef HAVE_GETPEERNAME
    if(!getaddressinfo((struct sockaddr*)&ssrem,
                       conn->primary_ip, &conn->primary_port)) {
      failf(data, "ssrem inet_ntop() failed with errno %d: %s",
            errno, Curl_strerror(errno, buffer, sizeof(buffer)));
      return;
    }
    memcpy(conn->ip_addr_str, conn->primary_ip, MAX_IPADR_LEN);
#endif
#ifdef HAVE_GETSOCKNAME
    if(!getaddressinfo((struct sockaddr*)&ssloc,
                       conn->local_ip, &conn->local_port)) {
      failf(data, "ssloc inet_ntop() failed with errno %d: %s",
            errno, Curl_strerror(errno, buffer, sizeof(buffer)));
      return;
    }
#endif
  }
#else /* !HAVE_GETSOCKNAME && !HAVE_GETPEERNAME */
  (void)sockfd; /* unused */
#endif

  /* persist connection info in session handle */
  Curl_persistconninfo(conn);
}